

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImU32 ImHashData(void *data_p,size_t data_size,ImU32 seed)

{
  ImU32 *crc32_lut;
  uchar *data;
  ImU32 crc;
  ImU32 seed_local;
  size_t data_size_local;
  void *data_p_local;
  
  data._0_4_ = seed ^ 0xffffffff;
  crc32_lut = (ImU32 *)data_p;
  _crc = data_size;
  while (_crc != 0) {
    data._0_4_ = (uint)data >> 8 ^ GCrc32LookupTable[(uint)data & 0xff ^ (uint)(byte)*crc32_lut];
    crc32_lut = (ImU32 *)((long)crc32_lut + 1);
    _crc = _crc - 1;
  }
  return (uint)data ^ 0xffffffff;
}

Assistant:

ImU32 ImHashData(const void* data_p, size_t data_size, ImU32 seed)
{
    ImU32 crc = ~seed;
    const unsigned char* data = (const unsigned char*)data_p;
    const ImU32* crc32_lut = GCrc32LookupTable;
    while (data_size-- != 0)
        crc = (crc >> 8) ^ crc32_lut[(crc & 0xFF) ^ *data++];
    return ~crc;
}